

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBaseClass.cpp
# Opt level: O0

void __thiscall
vkt::Draw::DrawTestsBaseClass::initPipeline(DrawTestsBaseClass *this,VkDevice device)

{
  DeviceInterface *pDVar1;
  StencilOpState _front;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  StencilOpState _back;
  VkAllocationCallbacks *pVVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  Handle<(vk::HandleType)16> *pHVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)14> *pHVar7;
  VkPipelineCache local_770;
  Move<vk::Handle<(vk::HandleType)18>_> local_768;
  RefData<vk::Handle<(vk::HandleType)18>_> local_748;
  allocator<unsigned_int> local_725;
  value_type_conflict2 local_724;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_720;
  MultiSampleState local_708;
  VkPipelineRasterizationStateCreateInfo local_6c0;
  VkStencilOpState local_680;
  VkStencilOpState local_660;
  VkPipelineDepthStencilStateCreateInfo local_640;
  allocator<vk::VkRect2D> local_5d1;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_5d0;
  allocator<vk::VkViewport> local_5b1;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_5b0;
  ViewportState local_598;
  ColorBlendState local_538;
  VkPipelineInputAssemblyStateCreateInfo local_4e8;
  VkPipelineVertexInputStateCreateInfo local_4c8;
  deUint64 local_498;
  VkPipelineShaderStageCreateInfo local_490;
  deUint64 local_460;
  VkPipelineShaderStageCreateInfo local_458;
  deUint64 local_428;
  VkPipelineLayout local_420;
  undefined1 local_418 [8];
  PipelineCreateInfo pipelineCreateInfo;
  VkRect2D scissor;
  VkViewport viewport;
  Attachment vkCbAttachmentState;
  RefData<vk::Handle<(vk::HandleType)14>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  Move<vk::Handle<(vk::HandleType)14>_> local_78;
  RefData<vk::Handle<(vk::HandleType)14>_> local_58;
  undefined1 local_38 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  VkDevice device_local;
  DrawTestsBaseClass *this_local;
  
  pDVar1 = this->m_vk;
  vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)device;
  pPVar3 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&this->m_vertexShaderName);
  ::vk::createShaderModule(&local_78,pDVar1,device,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface._0_4_ = (int)local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_58.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_58.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_58.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_58.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_58.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_78);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = this->m_vk;
  pPVar3 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp,pDVar1,
             (VkDevice)pVVar2,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c8,
             (Move *)&vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp);
  PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)&viewport.minDepth,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,
             VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf
            );
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  viewport.x = 256.0;
  viewport.y = 256.0;
  viewport.width = 0.0;
  viewport.height = 1.0;
  pipelineCreateInfo.m_multisampleStateSampleMask.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  pipelineCreateInfo.m_multisampleStateSampleMask.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  scissor.offset.x = 0x100;
  scissor.offset.y = 0x100;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_420.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_428 = pHVar6->m_internal;
  PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_418,local_420,(VkRenderPass)local_428,0,0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_38);
  local_460 = pHVar7->m_internal;
  PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_458,(VkShaderModule)local_460,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  PipelineCreateInfo::addShader((PipelineCreateInfo *)local_418,&local_458);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  local_498 = pHVar7->m_internal;
  PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_490,(VkShaderModule)local_498,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  PipelineCreateInfo::addShader((PipelineCreateInfo *)local_418,&local_490);
  local_4c8.sType = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType;
  local_4c8._4_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_4c8.pNext = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_4c8.flags = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  local_4c8.vertexBindingDescriptionCount =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexBindingDescriptionCount;
  local_4c8.pVertexBindingDescriptions =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_4c8.vertexAttributeDescriptionCount =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexAttributeDescriptionCount;
  local_4c8._36_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x24;
  local_4c8.pVertexAttributeDescriptions =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexAttributeDescriptions;
  PipelineCreateInfo::addState((PipelineCreateInfo *)local_418,&local_4c8);
  PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_4e8,this->m_topology,0);
  PipelineCreateInfo::addState((PipelineCreateInfo *)local_418,&local_4e8);
  PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_538,1,(VkPipelineColorBlendAttachmentState *)&viewport.minDepth,0,
             VK_LOGIC_OP_COPY);
  PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_418,&local_538.super_VkPipelineColorBlendStateCreateInfo);
  PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_538);
  std::allocator<vk::VkViewport>::allocator(&local_5b1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            (&local_5b0,1,(value_type *)&scissor.extent,&local_5b1);
  std::allocator<vk::VkRect2D>::allocator(&local_5d1);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            (&local_5d0,1,
             (value_type *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_5d1);
  PipelineCreateInfo::ViewportState::ViewportState(&local_598,1,&local_5b0,&local_5d0);
  PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_418,&local_598.super_VkPipelineViewportStateCreateInfo);
  PipelineCreateInfo::ViewportState::~ViewportState(&local_598);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_5d0);
  std::allocator<vk::VkRect2D>::~allocator(&local_5d1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_5b0);
  std::allocator<vk::VkViewport>::~allocator(&local_5b1);
  PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_660,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_680,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_660.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_660.failOp;
  _front.super_VkStencilOpState.passOp = local_660.passOp;
  _front.super_VkStencilOpState.compareOp = local_660.compareOp;
  _front.super_VkStencilOpState.compareMask = local_660.compareMask;
  _front.super_VkStencilOpState.writeMask = local_660.writeMask;
  _front.super_VkStencilOpState.reference = local_660.reference;
  _back.super_VkStencilOpState.depthFailOp = local_680.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_680.failOp;
  _back.super_VkStencilOpState.passOp = local_680.passOp;
  _back.super_VkStencilOpState.compareOp = local_680.compareOp;
  _back.super_VkStencilOpState.compareMask = local_680.compareMask;
  _back.super_VkStencilOpState.writeMask = local_680.writeMask;
  _back.super_VkStencilOpState.reference = local_680.reference;
  PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_640,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  PipelineCreateInfo::addState((PipelineCreateInfo *)local_418,&local_640);
  PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_6c0,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  PipelineCreateInfo::addState((PipelineCreateInfo *)local_418,&local_6c0);
  local_724 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_725);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_720,1,&local_724,&local_725);
  PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_708,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_720,false,false);
  PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_418,&local_708.super_VkPipelineMultisampleStateCreateInfo);
  PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_708);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_720);
  std::allocator<unsigned_int>::~allocator(&local_725);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = this->m_vk;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_770,0);
  ::vk::createGraphicsPipeline
            (&local_768,pDVar1,(VkDevice)pVVar2,local_770,(VkGraphicsPipelineCreateInfo *)local_418,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_748,(Move *)&local_768);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_748.deleter.m_deviceIface;
  data_01.object.m_internal = local_748.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_748.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_748.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_748.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_748.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_748.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_768);
  PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_418);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38);
  return;
}

Assistant:

void DrawTestsBaseClass::initPipeline (const vk::VkDevice device)
{
	const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
	const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

	const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

	vk::VkViewport viewport;
	viewport.x				= 0;
	viewport.y				= 0;
	viewport.width			= static_cast<float>(WIDTH);
	viewport.height			= static_cast<float>(HEIGHT);
	viewport.minDepth		= 0.0f;
	viewport.maxDepth		= 1.0f;

	vk::VkRect2D scissor;
	scissor.offset.x		= 0;
	scissor.offset.y		= 0;
	scissor.extent.width	= WIDTH;
	scissor.extent.height	= HEIGHT;

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<vk::VkViewport>(1, viewport), std::vector<vk::VkRect2D>(1, scissor)));
	pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());

	m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
}